

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O3

int aom_vector_var_avx2(int16_t *ref,int16_t *src,int bwl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  sbyte sVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  switch(bwl) {
  case 2:
    auVar12 = vpsubw_avx2(*(undefined1 (*) [32])ref,*(undefined1 (*) [32])src);
    auVar11 = vpmaddwd_avx2(auVar12,auVar12);
    sVar10 = 4;
    break;
  case 3:
    auVar2 = vpsubw_avx2(*(undefined1 (*) [32])ref,*(undefined1 (*) [32])src);
    auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(ref + 0x10),*(undefined1 (*) [32])(src + 0x10));
    auVar12 = vpmaddwd_avx2(auVar2,auVar2);
    auVar13 = vpmaddwd_avx2(auVar3,auVar3);
    auVar11 = vpaddd_avx2(auVar13,auVar12);
    auVar12 = vpaddw_avx2(auVar3,auVar2);
    sVar10 = 5;
    break;
  case 4:
    auVar2 = vpsubw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])ref);
    auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x10),*(undefined1 (*) [32])(ref + 0x10));
    auVar4 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x20),*(undefined1 (*) [32])(ref + 0x20));
    auVar5 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x30),*(undefined1 (*) [32])(ref + 0x30));
    auVar12 = vpmaddwd_avx2(auVar2,auVar2);
    auVar13 = vpmaddwd_avx2(auVar3,auVar3);
    auVar12 = vpaddd_avx2(auVar13,auVar12);
    auVar13 = vpmaddwd_avx2(auVar4,auVar4);
    auVar11 = vpmaddwd_avx2(auVar5,auVar5);
    auVar13 = vpaddd_avx2(auVar13,auVar11);
    auVar11 = vpaddd_avx2(auVar12,auVar13);
    auVar12 = vpaddw_avx2(auVar3,auVar2);
    auVar13 = vpaddw_avx2(auVar4,auVar5);
    auVar12 = vpaddw_avx2(auVar12,auVar13);
    sVar10 = 6;
    break;
  case 5:
    auVar2 = vpsubw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])ref);
    auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x10),*(undefined1 (*) [32])(ref + 0x10));
    auVar4 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x20),*(undefined1 (*) [32])(ref + 0x20));
    auVar5 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x30),*(undefined1 (*) [32])(ref + 0x30));
    auVar12 = vpmaddwd_avx2(auVar2,auVar2);
    auVar13 = vpmaddwd_avx2(auVar3,auVar3);
    auVar12 = vpaddd_avx2(auVar13,auVar12);
    auVar13 = vpmaddwd_avx2(auVar4,auVar4);
    auVar11 = vpmaddwd_avx2(auVar5,auVar5);
    auVar13 = vpaddd_avx2(auVar13,auVar11);
    auVar12 = vpaddd_avx2(auVar12,auVar13);
    auVar6 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x40),*(undefined1 (*) [32])(ref + 0x40));
    auVar7 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x50),*(undefined1 (*) [32])(ref + 0x50));
    auVar8 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x60),*(undefined1 (*) [32])(ref + 0x60));
    auVar9 = vpsubw_avx2(*(undefined1 (*) [32])(src + 0x70),*(undefined1 (*) [32])(ref + 0x70));
    auVar13 = vpmaddwd_avx2(auVar6,auVar6);
    auVar11 = vpmaddwd_avx2(auVar7,auVar7);
    auVar13 = vpaddd_avx2(auVar13,auVar11);
    auVar11 = vpmaddwd_avx2(auVar8,auVar8);
    auVar13 = vpaddd_avx2(auVar13,auVar11);
    auVar12 = vpaddd_avx2(auVar13,auVar12);
    auVar13 = vpmaddwd_avx2(auVar9,auVar9);
    auVar11 = vpaddd_avx2(auVar13,auVar12);
    auVar12 = vpaddw_avx2(auVar3,auVar2);
    auVar13 = vpaddw_avx2(auVar4,auVar5);
    auVar12 = vpaddw_avx2(auVar12,auVar13);
    auVar13 = vpaddw_avx2(auVar6,auVar7);
    auVar13 = vpaddw_avx2(auVar13,auVar8);
    auVar12 = vpaddw_avx2(auVar12,auVar13);
    auVar12 = vpaddw_avx2(auVar9,auVar12);
    sVar10 = 7;
    break;
  default:
    return 0;
  }
  auVar13._8_2_ = 1;
  auVar13._0_8_ = 0x1000100010001;
  auVar13._10_2_ = 1;
  auVar13._12_2_ = 1;
  auVar13._14_2_ = 1;
  auVar13._16_2_ = 1;
  auVar13._18_2_ = 1;
  auVar13._20_2_ = 1;
  auVar13._22_2_ = 1;
  auVar13._24_2_ = 1;
  auVar13._26_2_ = 1;
  auVar13._28_2_ = 1;
  auVar13._30_2_ = 1;
  auVar12 = vpmaddwd_avx2(auVar12,auVar13);
  auVar12 = vphaddd_avx2(auVar12,auVar11);
  auVar13 = vpsrldq_avx2(auVar12,4);
  auVar12 = vpaddd_avx2(auVar12,auVar13);
  auVar1 = vpaddd_avx(auVar12._16_16_,auVar12._0_16_);
  return auVar1._8_4_ - ((uint)(auVar1._0_4_ * auVar1._0_4_) >> sVar10);
}

Assistant:

int aom_vector_var_avx2(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0 && width <= 128);
  int var = 0;

  // Instead of having a loop over width 16, considered loop unrolling to avoid
  // some addition operations.
  if (width == 128) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    calc_vector_mean_sse_64wd(src + 64, ref + 64, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 64) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 32) {
    const __m256i src_line0 = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line0 = _mm256_loadu_si256((const __m256i *)ref);
    const __m256i src_line1 = _mm256_loadu_si256((const __m256i *)(src + 16));
    const __m256i ref_line1 = _mm256_loadu_si256((const __m256i *)(ref + 16));

    const __m256i diff0 = _mm256_sub_epi16(ref_line0, src_line0);
    const __m256i diff1 = _mm256_sub_epi16(ref_line1, src_line1);
    const __m256i diff_sqr0 = _mm256_madd_epi16(diff0, diff0);
    const __m256i diff_sqr1 = _mm256_madd_epi16(diff1, diff1);
    const __m256i sse = _mm256_add_epi32(diff_sqr0, diff_sqr1);
    __m256i mean = _mm256_add_epi16(diff0, diff1);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 16) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line = _mm256_loadu_si256((const __m256i *)ref);
    __m256i mean = _mm256_sub_epi16(ref_line, src_line);
    const __m256i sse = _mm256_madd_epi16(mean, mean);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  }
  return var;
}